

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O2

int __thiscall ncnn::ParamDict::load_param_bin(ParamDict *this,FILE *fp)

{
  int iVar1;
  size_t __n;
  Mat *this_00;
  anon_union_4_2_947300a4_for_anon_struct_64_3_9ed89b7b_1 *__ptr;
  long lVar2;
  int len;
  int id;
  FILE *local_38;
  
  clear(this);
  id = 0;
  fread(&id,4,1,(FILE *)fp);
  local_38 = (FILE *)fp;
  while( true ) {
    __n = 1;
    if ((ulong)(uint)id == 0xffffff17) break;
    if (id < -0x5b03) {
      lVar2 = 0xffffa4fc - (ulong)(uint)id;
      id = (int)lVar2;
      len = 0;
      fread(&len,4,1,(FILE *)fp);
      iVar1 = len;
      this_00 = (Mat *)((long)this + lVar2 * 0x40 + 0x18);
      Mat::create(this_00,len,4,(Allocator *)0x0);
      __ptr = (anon_union_4_2_947300a4_for_anon_struct_64_3_9ed89b7b_1 *)this_00->data;
      __n = (size_t)iVar1;
      fp = (FILE *)local_38;
    }
    else {
      lVar2 = (long)id;
      __ptr = &this->params[lVar2].field_1;
    }
    fread(__ptr,4,__n,(FILE *)fp);
    this->params[lVar2].loaded = 1;
    fread(&id,4,1,(FILE *)fp);
  }
  return 0;
}

Assistant:

int ParamDict::load_param_bin(FILE* fp)
{
    clear();

//     binary 0
//     binary 100
//     binary 1
//     binary 1.250000
//     binary 3 | array_bit
//     binary 5
//     binary 0.1
//     binary 0.2
//     binary 0.4
//     binary 0.8
//     binary 1.0
//     binary -233(EOP)

    int id = 0;
    fread(&id, sizeof(int), 1, fp);

    while (id != -233)
    {
        bool is_array = id <= -23300;
        if (is_array)
        {
            id = -id - 23300;
        }

        if (is_array)
        {
            int len = 0;
            fread(&len, sizeof(int), 1, fp);

            params[id].v.create(len);

            float* ptr = params[id].v;
            fread(ptr, sizeof(float), len, fp);
        }
        else
        {
            fread(&params[id].f, sizeof(float), 1, fp);
        }

        params[id].loaded = 1;

        fread(&id, sizeof(int), 1, fp);
    }

    return 0;
}